

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this_00;
  basic_format_specs<wchar_t> *pbVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  string groups;
  string local_118;
  format_specs local_f8;
  ulong local_c8;
  ulong uStack_c0;
  wchar_t local_b8 [2];
  wchar_t awStack_b0 [6];
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::num_writer>
  local_98;
  
  this_00 = this->writer;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118.field_2._M_allocated_capacity._0_2_ = 3;
  local_118._M_string_length = 1;
  pbVar2 = this->specs;
  cVar1 = pbVar2->thousands;
  if (cVar1 == '\0') {
    on_dec(this);
  }
  else {
    uVar3 = (ulong)this->abs_value;
    uVar4 = *(ulong *)((long)&this->abs_value + 8);
    auVar10 = (undefined1  [16])this->abs_value;
    uVar8 = 1;
    if ((uVar3 < 10) <= uVar4) {
      uVar8 = 1;
      do {
        uVar7 = auVar10._8_8_;
        uVar6 = auVar10._0_8_;
        if (uVar7 < (uVar6 < 100)) {
          iVar5 = 1;
LAB_018062a4:
          uVar8 = uVar8 + iVar5;
          if (uVar8 < 4) goto LAB_018062c8;
          break;
        }
        if (uVar7 < (uVar6 < 1000)) {
          iVar5 = 2;
          goto LAB_018062a4;
        }
        if (uVar7 < (uVar6 < 10000)) {
          iVar5 = 3;
          goto LAB_018062a4;
        }
        auVar10 = __udivti3(uVar6,uVar7,10000,0);
        uVar8 = uVar8 + 4;
      } while ((uVar6 < 100000) <= uVar7);
      uVar8 = uVar8 + (int)(uVar8 - 4) / 3 + 1;
    }
LAB_018062c8:
    local_98.prefix.size_ = (size_t)this->prefix_size;
    local_98.prefix.data_ = this->prefix;
    local_f8._32_8_ = *(undefined8 *)((pbVar2->fill).data_ + 5);
    local_f8.width = pbVar2->width;
    local_f8.precision = pbVar2->precision;
    uStack_c0._0_1_ = pbVar2->type;
    uStack_c0._1_3_ = *(undefined3 *)&pbVar2->field_0x9;
    uStack_c0._4_4_ = (pbVar2->fill).data_[0];
    local_f8.fill.data_._4_8_ = *(undefined8 *)((pbVar2->fill).data_ + 1);
    local_f8.fill.data_._12_8_ = *(undefined8 *)((pbVar2->fill).data_ + 3);
    uVar6 = uVar8 + local_98.prefix.size_;
    local_f8._9_1_ = SUB31(uStack_c0._1_3_,0);
    local_98.fill = uStack_c0._4_4_;
    local_f8._8_8_ = uStack_c0;
    if ((local_f8._9_1_ & 0xf) == 4) {
      uVar7 = local_f8._0_8_ & 0xffffffff;
      local_98.size_ = uVar6;
      local_98.padding = 0;
      if (uVar6 <= uVar7) {
        local_98.size_ = uVar7;
        local_98.padding = uVar7 - uVar6;
      }
    }
    else {
      local_98.padding = 0;
      uVar9 = local_f8.precision - uVar8;
      if (uVar9 != 0 && (int)uVar8 <= (int)local_f8.precision) {
        local_98.fill = L'0';
      }
      if (uVar9 != 0 && (int)uVar8 <= (int)local_f8.precision) {
        uVar6 = (uint)local_f8.precision + local_98.prefix.size_;
        local_98.padding = (ulong)uVar9;
      }
      local_98.size_ = uVar6;
      if ((uStack_c0 & 0xf00) == 0) {
        local_f8._8_8_ = uStack_c0 | 0x200;
      }
    }
    local_98.f.groups = &local_118;
    local_c8 = local_f8._0_8_;
    local_b8 = (wchar_t  [2])local_f8.fill.data_._4_8_;
    awStack_b0._0_8_ = local_f8.fill.data_._12_8_;
    awStack_b0._8_8_ = local_f8._32_8_;
    local_98.f.abs_value._0_8_ = uVar3;
    local_98.f.abs_value._8_8_ = uVar4;
    local_98.f.size = uVar8;
    local_98.f.sep = (int)cVar1;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<wchar_t>>::num_writer>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this_00,&local_f8,&local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }